

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
SimpleTransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++:974:7)>
::getImpl(SimpleTransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_test_util_c__:974:7)>
          *this,ExceptionOrValue *output)

{
  ResponseHook *pRVar1;
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> depResult;
  ExceptionOrValue local_3b0;
  char local_218;
  Response<capnproto_test::capnp::test::TestInterface::FooResults> local_210;
  ExceptionOr<kj::_::Void> local_1d0;
  
  local_3b0.exception.ptr.isSet = false;
  local_218 = '\0';
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,&local_3b0);
  if (local_3b0.exception.ptr.isSet == true) {
    local_1d0.super_ExceptionOrValue.exception.ptr.isSet = true;
    local_1d0.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr =
         local_3b0.exception.ptr.field_1.value.ownFile.content.ptr;
    local_1d0.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ =
         local_3b0.exception.ptr.field_1.value.ownFile.content.size_;
    local_1d0.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer =
         local_3b0.exception.ptr.field_1.value.ownFile.content.disposer;
    local_3b0.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_3b0.exception.ptr.field_1.value.ownFile.content.size_ = 0;
    local_1d0.super_ExceptionOrValue.exception.ptr.field_1.value.file =
         local_3b0.exception.ptr.field_1.value.file;
    local_1d0.super_ExceptionOrValue.exception.ptr.field_1._32_8_ =
         local_3b0.exception.ptr.field_1._32_8_;
    local_1d0.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr =
         local_3b0.exception.ptr.field_1.value.description.content.ptr;
    local_1d0.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ =
         local_3b0.exception.ptr.field_1.value.description.content.size_;
    local_1d0.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer =
         local_3b0.exception.ptr.field_1.value.description.content.disposer;
    local_3b0.exception.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_3b0.exception.ptr.field_1.value.description.content.size_ = 0;
    local_1d0.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer =
         local_3b0.exception.ptr.field_1.value.context.ptr.disposer;
    local_1d0.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr =
         local_3b0.exception.ptr.field_1.value.context.ptr.ptr;
    local_3b0.exception.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    local_1d0.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.ptr =
         local_3b0.exception.ptr.field_1.value.remoteTrace.content.ptr;
    local_1d0.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.size_ =
         local_3b0.exception.ptr.field_1.value.remoteTrace.content.size_;
    local_1d0.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.disposer =
         local_3b0.exception.ptr.field_1.value.remoteTrace.content.disposer;
    local_3b0.exception.ptr.field_1.value.remoteTrace.content.ptr = (char *)0x0;
    local_3b0.exception.ptr.field_1.value.remoteTrace.content.size_ = 0;
    memcpy((void *)((long)&local_1d0.super_ExceptionOrValue.exception.ptr.field_1 + 0x68),
           (void *)((long)&local_3b0.exception.ptr.field_1 + 0x68),0x105);
    local_1d0.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.ptr =
         local_3b0.exception.ptr.field_1.value.details.builder.ptr;
    local_1d0.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.pos =
         local_3b0.exception.ptr.field_1.value.details.builder.pos;
    local_1d0.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.endPtr =
         local_3b0.exception.ptr.field_1.value.details.builder.endPtr;
    local_1d0.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.disposer =
         local_3b0.exception.ptr.field_1.value.details.builder.disposer;
    local_3b0.exception.ptr.field_1.value.details.builder.ptr = (Detail *)0x0;
    local_3b0.exception.ptr.field_1.value.details.builder.pos =
         (RemoveConst<kj::Exception::Detail> *)0x0;
    local_3b0.exception.ptr.field_1.value.details.builder.endPtr = (Detail *)0x0;
    local_1d0.value.ptr.isSet = false;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_1d0);
  }
  else {
    if (local_218 != '\x01') goto LAB_0020181e;
    anon_class_16_2_06e2585c_for_func::operator()(&this->func,&local_210);
    local_1d0.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_1d0.value.ptr.isSet = true;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_1d0);
  }
  if (local_1d0.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&local_1d0.super_ExceptionOrValue.exception.ptr.field_1.value);
  }
LAB_0020181e:
  pRVar1 = local_210.hook.ptr;
  if ((local_218 == '\x01') && (local_210.hook.ptr != (ResponseHook *)0x0)) {
    local_210.hook.ptr = (ResponseHook *)0x0;
    (**(local_210.hook.disposer)->_vptr_Disposer)
              (local_210.hook.disposer,
               (_func_int *)
               ((long)&pRVar1->_vptr_ResponseHook + (long)pRVar1->_vptr_ResponseHook[-2]));
  }
  if (local_3b0.exception.ptr.isSet == true) {
    Exception::~Exception(&local_3b0.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }